

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

bool __thiscall
QArrayDataPointer<char>::tryReadjustFreeSpace
          (QArrayDataPointer<char> *this,GrowthPosition pos,qsizetype n,char **data)

{
  Data *pDVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  pDVar1 = this->d;
  if (pDVar1 == (Data *)0x0) {
    lVar4 = 0;
    lVar3 = 0;
    lVar6 = 0;
  }
  else {
    lVar3 = (pDVar1->super_QArrayData).alloc;
    uVar5 = (ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7) & 0xfffffffffffffff0;
    lVar4 = (long)this->ptr - uVar5;
    lVar6 = (uVar5 + lVar3) - (long)(this->ptr + this->size);
  }
  if ((pos == GrowsAtEnd) && (n <= lVar4)) {
    lVar2 = this->size * 3;
    lVar6 = 0;
    if (SBORROW8(lVar2,lVar3 * 2) != lVar2 + lVar3 * -2 < 0) {
LAB_00119e59:
      relocate(this,lVar6 - lVar4,data);
      return true;
    }
  }
  else if ((pos == GrowsAtBeginning) && (n <= lVar6)) {
    if (lVar3 <= this->size * 3) {
      return false;
    }
    lVar3 = (lVar3 - (this->size + n)) / 2;
    lVar6 = 0;
    if (0 < lVar3) {
      lVar6 = lVar3;
    }
    lVar6 = lVar6 + n;
    goto LAB_00119e59;
  }
  return false;
}

Assistant:

qsizetype constAllocatedCapacity() const noexcept { return d ? d->constAllocatedCapacity() : 0; }